

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

void __thiscall duckdb::CSVErrorHandler::Insert(CSVErrorHandler *this,idx_t boundary_idx,idx_t rows)

{
  unordered_map<unsigned_long,_duckdb::LinesPerBoundary,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  idx_t local_30;
  LinesPerBoundary local_28;
  
  local_30 = boundary_idx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this_00 = &this->lines_per_batch_map;
    iVar2 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_30);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_false>.
        _M_cur == (__node_type *)0x0) {
      LinesPerBoundary::LinesPerBoundary(&local_28,local_30,rows);
      pmVar3 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_30);
      pmVar3->boundary_idx = local_28.boundary_idx;
      pmVar3->lines_in_batch = local_28.lines_in_batch;
    }
    else {
      pmVar3 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_30);
      pmVar3->lines_in_batch = pmVar3->lines_in_batch + rows;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void CSVErrorHandler::Insert(idx_t boundary_idx, idx_t rows) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (lines_per_batch_map.find(boundary_idx) == lines_per_batch_map.end()) {
		lines_per_batch_map[boundary_idx] = {boundary_idx, rows};
	} else {
		lines_per_batch_map[boundary_idx].lines_in_batch += rows;
	}
}